

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O2

void __thiscall covenant::DFA<covenant::Sym>::eps_close(DFA<covenant::Sym> *this,int state)

{
  uint value;
  pointer pvVar1;
  long lVar2;
  uint uVar3;
  uint ii;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  SparseSet<0> reach;
  
  SparseSet<0>::SparseSet
            (&reach,(uint)(((long)(this->trans).
                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->trans).
                                 super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  SparseSet<0>::insert(&reach,state);
  uVar4 = 0;
  while( true ) {
    pvVar1 = (this->eps).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)&pvVar1[state].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar1[state].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar2 >> 2) <= (ulong)uVar4) break;
    uVar3 = *(uint *)(lVar2 + (ulong)uVar4 * 4);
    if ((reach.members <= reach.sparse[uVar3]) || (reach.dense[reach.sparse[uVar3]] != uVar3)) {
      SparseSet<0>::insert(&reach,uVar3);
    }
    uVar4 = uVar4 + 1;
  }
  for (uVar4 = 1; uVar4 < reach.members; uVar4 = uVar4 + 1) {
    uVar3 = SparseSet<0>::operator[](&reach,uVar4);
    uVar5 = 0;
    while( true ) {
      uVar6 = (ulong)uVar5;
      pvVar1 = (this->eps).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar1[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar1[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data + 8) - lVar2 >> 2) <= uVar6) break;
      value = *(uint *)(lVar2 + uVar6 * 4);
      if ((reach.members <= reach.sparse[value]) || (reach.dense[reach.sparse[value]] != value)) {
        SparseSet<0>::insert(&reach,value);
        pvVar1 = (this->eps).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<int,_std::allocator<int>_>::push_back
                  (pvVar1 + state,
                   (value_type_conflict1 *)
                   (uVar6 * 4 +
                   *(long *)&pvVar1[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data));
      }
      uVar5 = uVar5 + 1;
    }
  }
  SparseSet<0>::~SparseSet(&reach);
  return;
}

Assistant:

void eps_close(int state)
    {
      SparseSet<> reach(nStates());
      reach.insert(state);
      for(unsigned int ei = 0; ei < eps[state].size(); ei++)
      {
        // Added the conditional test after observing some problems
        // running the CFG solver.
        if(!reach.elem(eps[state][ei]))
          reach.insert(eps[state][ei]);
      }

      for(unsigned int ii = 1; ii < reach.size(); ii++)
      {
        int es = reach[ii];
        for(unsigned int ei = 0; ei < eps[es].size(); ei++)
        {
          // Not yet processed
          if(!reach.elem(eps[es][ei]))
          { 
            reach.insert(eps[es][ei]);
            eps[state].push_back(eps[es][ei]);
          }
        }
      }
    }